

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.hpp
# Opt level: O2

entry * __thiscall libtorrent::entry::operator=(entry *this,char *v)

{
  allocator<char> local_11;
  
  destruct(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)this,v,&local_11);
  this->field_0x30 = (this->field_0x30 & 0x80) + 1;
  return this;
}

Assistant:

entry& operator=(U v) &
		{
			destruct();
			new(&data) string_type(std::move(v));
			m_type = string_t;
#if TORRENT_USE_ASSERTS
			m_type_queried = true;
#endif
			return *this;
		}